

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_bucket_bounds_Test::~HistogramTest_bucket_bounds_Test
          (HistogramTest_bucket_bounds_Test *this)

{
  HistogramTest_bucket_bounds_Test *this_local;
  
  ~HistogramTest_bucket_bounds_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HistogramTest, bucket_bounds) {
  Histogram histogram{{1, 2}};
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.bucket.at(0).upper_bound, 1);
  EXPECT_EQ(h.bucket.at(1).upper_bound, 2);
  EXPECT_EQ(h.bucket.at(2).upper_bound,
            std::numeric_limits<double>::infinity());
}